

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cmpi_32_pcix(void)

{
  uint uVar1;
  uint uVar2;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    uVar1 = m68ki_read_imm_32();
    uVar2 = OPER_PCIX_32();
    m68ki_cpu.not_z_flag = uVar2 - uVar1;
    m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
    m68ki_cpu.v_flag = ((m68ki_cpu.not_z_flag ^ uVar2) & (uVar2 ^ uVar1)) >> 0x18;
    m68ki_cpu.c_flag =
         ((m68ki_cpu.not_z_flag | uVar1) & ~uVar2 | m68ki_cpu.not_z_flag & uVar1) >> 0x17;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_cmpi_32_pcix(void)
{
    if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
    // if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint src = OPER_I_32();
		uint dst = OPER_PCIX_32();
		uint res = dst - src;

		FLAG_N = NFLAG_32(res);
		FLAG_Z = MASK_OUT_ABOVE_32(res);
		FLAG_V = VFLAG_SUB_32(src, dst, res);
		FLAG_C = CFLAG_SUB_32(src, dst, res);
		return;
	}
	m68ki_exception_illegal();
}